

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<unsigned_long,unsigned_long>::
     construct<std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
               (allocator<std::pair<const_unsigned_long,_unsigned_long>_> *alloc,slot_type *slot,
               piecewise_construct_t *args,tuple<const_unsigned_long_&> *args_1,tuple<> *args_2)

{
  piecewise_construct_t *in_RCX;
  pair<unsigned_long,_unsigned_long> *in_RDX;
  allocator<std::pair<const_unsigned_long,_unsigned_long>_> *in_RSI;
  tuple<const_unsigned_long_&> *in_R8;
  
  map_slot_policy<unsigned_long,_unsigned_long>::emplace((slot_type *)0x205f46);
  allocator_traits<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>::
  construct<std::pair<unsigned_long,unsigned_long>,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
            (in_RSI,in_RDX,in_RCX,in_R8,(tuple<> *)0x205f63);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}